

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopyJsonNameTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  Descriptor *pDVar1;
  FieldDescriptor *pFVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *proto_01;
  long lVar3;
  long lVar4;
  string_view str;
  LogMessage local_40;
  
  if ((this->message_type_count_ == *(int *)((long)&proto->field_0 + 0x28)) &&
     (this->extension_count_ == *(int *)((long)&proto->field_0 + 0x70))) {
    if (0 < this->message_type_count_) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pDVar1 = this->message_types_;
        proto_00 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                             (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                              (int)lVar4);
        Descriptor::CopyJsonNameTo((Descriptor *)(&pDVar1->super_SymbolBase + lVar3),proto_00);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0xa0;
      } while (lVar4 < this->message_type_count_);
    }
    if (0 < this->extension_count_) {
      lVar3 = 0;
      lVar4 = 0;
      do {
        pFVar2 = this->extensions_;
        proto_01 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                             (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                              (int)lVar4);
        FieldDescriptor::CopyJsonNameTo
                  ((FieldDescriptor *)(&pFVar2->super_SymbolBase + lVar3),proto_01);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x58;
      } while (lVar4 < this->extension_count_);
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0xc72);
    str._M_str = "Cannot copy json_name to a proto of a different size.";
    str._M_len = 0x35;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
  }
  return;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol<ParentNameFieldQuery>(this, name);
}